

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

char * lj_buf_more2(SBuf *sb,MSize sz)

{
  uint in_ESI;
  lua_State *in_RDI;
  SBuf *unaff_retaddr;
  MSize len;
  
  if (0x7fffff00 < in_ESI ||
      0x7fffff00 < ((in_RDI->nextgc).gcptr32 - (in_RDI->glref).ptr32) + in_ESI) {
    lj_err_mem(in_RDI);
  }
  buf_grow(unaff_retaddr,(MSize)((ulong)in_RDI >> 0x20));
  return (char *)(ulong)(in_RDI->nextgc).gcptr32;
}

Assistant:

LJ_NOINLINE char *LJ_FASTCALL lj_buf_more2(SBuf *sb, MSize sz)
{
  MSize len = sbuflen(sb);
  lj_assertG_(G(sbufL(sb)), sz > sbufleft(sb), "SBuf overflow");
  if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
    lj_err_mem(sbufL(sb));
  buf_grow(sb, len + sz);
  return sbufP(sb);
}